

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operator.cpp
# Opt level: O2

void __thiscall
adios2::core::Operator::RunCallback1
          (Operator *this,uint32_t *arg0,string *arg1,string *arg2,string *arg3,size_t arg4,
          Dims *arg5,Dims *arg6,Dims *arg7)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"Callback1",&local_31);
  CheckCallbackType(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Operator::RunCallback2(void *arg0, const std::string &arg1, const std::string &arg2,
                            const std::string &arg3, const size_t arg4, const Dims &arg5,
                            const Dims &arg6, const Dims &arg7) const
{
    CheckCallbackType("Callback2");
}